

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf8Dfa.h
# Opt level: O3

void __thiscall
axl::enc::Utf8Dfa::
emitPendingCus<axl::enc::Convert<axl::enc::Utf8,axl::enc::Utf8,axl::enc::ToLowerCase,axl::enc::Utf8Decoder>::CountingEmitter>
          (Utf8Dfa *this,CountingEmitter *emitter,utf8_t *p)

{
  uint_t uVar1;
  uint uVar2;
  
  uVar1 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_state;
  switch(uVar1 << 0x1d | uVar1 - 0x10 >> 3) {
  case 0:
  case 1:
    uVar2 = 0xc0;
    break;
  case 2:
  case 3:
    uVar2 = 0xe0;
    break;
  case 4:
    uVar2 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6 | 0xe0;
    goto LAB_0011ec5e;
  default:
    return;
  case 6:
  case 7:
    uVar2 = 0xf0;
    break;
  case 8:
    uVar2 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6 | 0xf0;
LAB_0011ec5e:
    Convert<axl::enc::Utf8,_axl::enc::Utf8,_axl::enc::ToLowerCase,_axl::enc::Utf8Decoder>::
    CountingEmitter::emitCp(emitter,p + -1,uVar2);
    uVar2 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp & 0x3fU | 0x80;
    goto LAB_0011ecb4;
  case 10:
    Convert<axl::enc::Utf8,_axl::enc::Utf8,_axl::enc::ToLowerCase,_axl::enc::Utf8Decoder>::
    CountingEmitter::emitCp
              (emitter,p + -2,
               (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 0xc | 0xf0);
    Convert<axl::enc::Utf8,_axl::enc::Utf8,_axl::enc::ToLowerCase,_axl::enc::Utf8Decoder>::
    CountingEmitter::emitCp
              (emitter,p + -1,
               (uint)(this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6 & 0x3f |
               0x80);
    uVar2 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp & 0x3fU | 0x80;
    goto LAB_0011ecb4;
  }
  uVar2 = uVar2 | (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp;
LAB_0011ecb4:
  Convert<axl::enc::Utf8,_axl::enc::Utf8,_axl::enc::ToLowerCase,_axl::enc::Utf8Decoder>::
  CountingEmitter::emitCp(emitter,p,uVar2);
  return;
}

Assistant:

void
	emitPendingCus(
		Emitter& emitter,
		const utf8_t* p
	) {
		switch (m_state) {
		case State_1_2:
		case State_1_2_Error:
			emitter.emitCu(p, 0xc0 | m_cp);
			break;

		case State_1_3:
		case State_1_3_Error:
			emitter.emitCu(p, 0xe0 | m_cp);
			break;

		case State_2_3:
			emitter.emitCu(p - 1, 0xe0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_1_4:
		case State_1_4_Error:
			emitter.emitCu(p, 0xf0 | m_cp);
			break;

		case State_2_4:
			emitter.emitCu(p - 1, 0xf0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_3_4:
			emitter.emitCu(p - 2, 0xf0 | (m_cp >> 12));
			emitter.emitCu(p - 1, 0x80 | ((m_cp >> 6) & 0x3f));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;
		}
	}